

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumDescriptor.cpp
# Opt level: O2

KBOOL KDIS::DATA_TYPE::ENUMS::GetEnumFromString
                (EnumDescriptor *pArray,KUINT32 NumElements,KString *Value,KINT32 *ValueOut)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  EnumDescriptor *pEVar4;
  
  pEVar4 = pArray + -1;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (NumElements == uVar3) goto LAB_0012d158;
    bVar2 = std::operator==(Value,pEVar4[1].Name);
    pEVar4 = pEVar4 + 1;
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  *ValueOut = pEVar4->Value;
LAB_0012d158:
  return uVar3 < NumElements;
}

Assistant:

KBOOL KDIS::DATA_TYPE::ENUMS::GetEnumFromString( const EnumDescriptor * pArray, KUINT32 NumElements, const KString & Value, KINT32 & ValueOut )
{
    for( KINT32 i = 0; i < NumElements; ++i )
    {
        if( Value == pArray[i].Name )
        {
            ValueOut = pArray[i].Value;
            return true;
        }
    }

    // No match found
    return false;
}